

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::TemplatedDecodeSortKey<duckdb::SortKeyConstantOperator<float>>
               (DecodeSortKeyData *decode_data,DecodeSortKeyVectorData *vector_data,Vector *result,
               idx_t result_idx)

{
  data_t dVar1;
  idx_t iVar2;
  
  dVar1 = decode_data->data[decode_data->position];
  iVar2 = decode_data->position + 1;
  decode_data->position = iVar2;
  if (dVar1 == vector_data->null_byte) {
    FlatVector::VerifyFlatVector(result);
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,result_idx);
    return;
  }
  iVar2 = SortKeyConstantOperator<float>::Decode
                    (decode_data->data + iVar2,result,result_idx,vector_data->flip_bytes);
  decode_data->position = decode_data->position + iVar2;
  return;
}

Assistant:

void TemplatedDecodeSortKey(DecodeSortKeyData &decode_data, DecodeSortKeyVectorData &vector_data, Vector &result,
                            idx_t result_idx) {
	auto validity_byte = decode_data.data[decode_data.position];
	decode_data.position++;
	if (validity_byte == vector_data.null_byte) {
		// NULL value
		FlatVector::Validity(result).SetInvalid(result_idx);
		return;
	}
	idx_t increment = OP::Decode(decode_data.data + decode_data.position, result, result_idx, vector_data.flip_bytes);
	decode_data.position += increment;
}